

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestBranchInternal2::TestBranchInternal2(TestBranchInternal2 *this,string *name)

{
  pointer pcVar1;
  TestRegistry *this_00;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  this_00 = testinator::TestRegistry::Instance();
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  (this->super_Test).m_success = true;
  (this->super_Test).m_skipped = false;
  (this->super_Test).m_name._M_dataplus._M_p = (pointer)&(this->super_Test).m_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Test).m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Test).m_registry = this_00;
  testinator::TestRegistry::Register(this_00,&this->super_Test,name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016af28;
  return;
}

Assistant:

TestBranchInternal2(const string& name)
    : testinator::Test(name)
  {}